

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcode
          (BinaryReaderObjdumpDisassemble *this,Opcode opcode)

{
  ulong uVar1;
  Offset OVar2;
  pointer this_00;
  size_t sVar3;
  char *pcVar4;
  char *opcode_name_1;
  char *pcStack_28;
  Opcode missing_opcode;
  char *opcode_name;
  BinaryReaderObjdumpDisassemble *this_local;
  Opcode opcode_local;
  
  this_local._0_4_ = opcode.enum_;
  anon_unknown_16::BinaryReaderObjdumpBase::OnOpcode(&this->super_BinaryReaderObjdumpBase,opcode);
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    if ((((this->super_BinaryReaderObjdumpBase).options_)->debug & 1U) != 0) {
      pcStack_28 = Opcode::GetName((Opcode *)&this_local);
      this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::
                operator->(&(this->super_BinaryReaderObjdumpBase).err_stream_);
      Stream::Writef(&this_00->super_Stream,"on_opcode: %#zx: %s\n",
                     ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                      super_BinaryReaderDelegate.state)->offset,pcStack_28);
    }
    if ((this->last_opcode_end == 0) ||
       (uVar1 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                 super_BinaryReaderDelegate.state)->offset, OVar2 = this->last_opcode_end,
       sVar3 = Opcode::GetLength((Opcode *)&this_local), OVar2 + sVar3 <= uVar1)) {
      this->current_opcode_offset =
           ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
           state)->offset;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      opcode_name_1._4_4_ =
           Opcode::FromCode((uint)(this->super_BinaryReaderObjdumpBase).data_[this->last_opcode_end]
                           );
      pcVar4 = Opcode::GetName((Opcode *)((long)&opcode_name_1 + 4));
      fprintf(_stderr,"error: %#zx missing opcode callback at %#zx (%#02x=%s)\n",
              ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset,this->last_opcode_end + 1,
              (ulong)(this->super_BinaryReaderObjdumpBase).data_[this->last_opcode_end],pcVar4);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcode(Opcode opcode) {
  BinaryReaderObjdumpBase::OnOpcode(opcode);
  if (!in_function_body) {
    return Result::Ok;
  }
  if (options_->debug) {
    const char* opcode_name = opcode.GetName();
    err_stream_->Writef("on_opcode: %#" PRIzx ": %s\n", state->offset,
                        opcode_name);
  }

  if (last_opcode_end) {
    // Takes care of cases where opcode's bytes was a non-canonical leb128
    // encoding. In this case, opcode.GetLength() under-reports the length,
    // since it canonicalizes the opcode.
    if (state->offset < last_opcode_end + opcode.GetLength()) {
      Opcode missing_opcode = Opcode::FromCode(data_[last_opcode_end]);
      const char* opcode_name = missing_opcode.GetName();
      fprintf(stderr,
              "error: %#" PRIzx " missing opcode callback at %#" PRIzx
              " (%#02x=%s)\n",
              state->offset, last_opcode_end + 1, data_[last_opcode_end],
              opcode_name);
      return Result::Error;
    }
  }

  current_opcode_offset = state->offset;
  return Result::Ok;
}